

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_controller.cpp
# Opt level: O0

void __thiscall r_exec::PGMController::reduce(PGMController *this,View *input)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  P<r_exec::Overlay> *pPVar4;
  Overlay *pOVar5;
  P *this_00;
  PGMOverlay *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  iterator iVar6;
  const_iterator cVar7;
  P<r_exec::Overlay> local_e8;
  Overlay *local_e0;
  Overlay *offspring_1;
  list<core::P<r_exec::Overlay>_> *local_d0;
  iterator local_c8;
  iterator local_b8;
  lock_guard<std::mutex> local_a8;
  lock_guard<std::mutex> guard_1;
  Overlay *offspring;
  list<core::P<r_exec::Overlay>_> *local_88;
  uint64_t local_80;
  uint64_t birth_time;
  list<core::P<r_exec::Overlay>_> *local_70;
  iterator local_68;
  iterator local_58 [2];
  long local_38;
  uint64_t now;
  lock_guard<std::mutex> guard;
  const_iterator o;
  View *input_local;
  PGMController *this_local;
  
  r_code::list<core::P<r_exec::Overlay>_>::const_iterator::const_iterator((const_iterator *)&guard);
  if ((this->super__PGMController).super_OController.super_Controller.tsc == 0) {
    std::lock_guard<std::mutex>::lock_guard
              (&local_a8,
               &(this->super__PGMController).super_OController.super_Controller.m_reductionMutex);
    local_b8 = r_code::list<core::P<r_exec::Overlay>_>::begin
                         (&(this->super__PGMController).super_OController.overlays);
    r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator=
              ((const_iterator *)&guard,&local_b8);
    while( true ) {
      iVar6 = r_code::list<core::P<r_exec::Overlay>_>::end
                        (&(this->super__PGMController).super_OController.overlays);
      local_c8 = iVar6;
      bVar1 = r_code::list<core::P<r_exec::Overlay>_>::_iterator::operator!=
                        ((_iterator *)&guard,&local_c8.super__iterator);
      if (!bVar1) break;
      pPVar4 = r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator*
                         ((const_iterator *)&guard);
      pOVar5 = core::P<r_exec::Overlay>::operator->(pPVar4);
      uVar2 = (*(pOVar5->super__Object)._vptr__Object[4])();
      if ((uVar2 & 1) == 0) {
        pPVar4 = r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator*
                           ((const_iterator *)&guard);
        pOVar5 = core::P<r_exec::Overlay>::operator->(pPVar4);
        iVar3 = (*(pOVar5->super__Object)._vptr__Object[3])(pOVar5,input);
        local_e0 = (Overlay *)CONCAT44(extraout_var_00,iVar3);
        if (local_e0 != (Overlay *)0x0) {
          core::P<r_exec::Overlay>::P(&local_e8,local_e0);
          r_code::list<core::P<r_exec::Overlay>_>::push_front
                    (&(this->super__PGMController).super_OController.overlays,&local_e8);
          core::P<r_exec::Overlay>::~P(&local_e8);
        }
        bVar1 = Controller::is_alive((Controller *)this);
        if (!bVar1) break;
        r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator++
                  ((const_iterator *)&guard);
      }
      else {
        cVar7 = r_code::list<core::P<r_exec::Overlay>_>::erase
                          (&(this->super__PGMController).super_OController.overlays,
                           (const_iterator *)&guard);
        local_d0 = cVar7._list;
        offspring_1 = (Overlay *)cVar7.super__iterator._cell;
        r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator=
                  ((const_iterator *)&guard,(const_iterator *)&offspring_1);
      }
    }
    std::lock_guard<std::mutex>::~lock_guard(&local_a8);
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)&now,
               &(this->super__PGMController).super_OController.super_Controller.m_reductionMutex);
    local_38 = (*Now)();
    local_58[0] = r_code::list<core::P<r_exec::Overlay>_>::begin
                            (&(this->super__PGMController).super_OController.overlays);
    r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator=
              ((const_iterator *)&guard,local_58);
    while( true ) {
      iVar6 = r_code::list<core::P<r_exec::Overlay>_>::end
                        (&(this->super__PGMController).super_OController.overlays);
      local_68 = iVar6;
      bVar1 = r_code::list<core::P<r_exec::Overlay>_>::_iterator::operator!=
                        ((_iterator *)&guard,&local_68.super__iterator);
      if (!bVar1) break;
      pPVar4 = r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator*
                         ((const_iterator *)&guard);
      pOVar5 = core::P<r_exec::Overlay>::operator->(pPVar4);
      uVar2 = (*(pOVar5->super__Object)._vptr__Object[4])();
      if ((uVar2 & 1) == 0) {
        this_00 = (P *)r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator*
                                 ((const_iterator *)&guard);
        this_01 = core::P::operator_cast_to_PGMOverlay_(this_00);
        local_80 = PGMOverlay::get_birth_time(this_01);
        if ((local_80 == 0) ||
           (local_38 - local_80 <=
            (this->super__PGMController).super_OController.super_Controller.tsc)) {
          pPVar4 = r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator*
                             ((const_iterator *)&guard);
          pOVar5 = core::P<r_exec::Overlay>::operator->(pPVar4);
          iVar3 = (*(pOVar5->super__Object)._vptr__Object[3])(pOVar5,input);
          if ((Overlay *)CONCAT44(extraout_var,iVar3) != (Overlay *)0x0) {
            core::P<r_exec::Overlay>::P
                      ((P<r_exec::Overlay> *)&guard_1,(Overlay *)CONCAT44(extraout_var,iVar3));
            r_code::list<core::P<r_exec::Overlay>_>::push_front
                      (&(this->super__PGMController).super_OController.overlays,
                       (P<r_exec::Overlay> *)&guard_1);
            core::P<r_exec::Overlay>::~P((P<r_exec::Overlay> *)&guard_1);
          }
          bVar1 = Controller::is_alive((Controller *)this);
          if (!bVar1) break;
          r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator++
                    ((const_iterator *)&guard);
        }
        else {
          cVar7 = r_code::list<core::P<r_exec::Overlay>_>::erase
                            (&(this->super__PGMController).super_OController.overlays,
                             (const_iterator *)&guard);
          local_88 = cVar7._list;
          offspring = (Overlay *)cVar7.super__iterator._cell;
          r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator=
                    ((const_iterator *)&guard,(const_iterator *)&offspring);
        }
      }
      else {
        cVar7 = r_code::list<core::P<r_exec::Overlay>_>::erase
                          (&(this->super__PGMController).super_OController.overlays,
                           (const_iterator *)&guard);
        local_70 = cVar7._list;
        birth_time = (uint64_t)cVar7.super__iterator._cell;
        r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator=
                  ((const_iterator *)&guard,(const_iterator *)&birth_time);
      }
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&now);
  }
  return;
}

Assistant:

void PGMController::reduce(r_exec::View *input)
{
    r_code::list<P<Overlay> >::const_iterator o;

    //uint64_t oid=input->object->get_oid();
    //uint64_t t=Now()-Utils::GetTimeReference();
    //std::cout<<Time::ToString_seconds(t)<<" got "<<oid<<" "<<input->get_sync()<<std::endl;
    if (tsc > 0) {
        std::lock_guard<std::mutex> guard(m_reductionMutex);
        uint64_t now = Now(); // call must be located after the CS.enter() since (*o)->reduce() may update (*o)->birth_time.

        //uint64_t t=now-Utils::GetTimeReference();
        for (o = overlays.begin(); o != overlays.end();) {
            if ((*o)->is_invalidated()) {
                o = overlays.erase(o);
            } else {
                uint64_t birth_time = ((PGMOverlay *)*o)->get_birth_time();

                if (birth_time > 0 && now - birth_time > tsc) {
                    //std::cout<<Time::ToString_seconds(t)<<" kill "<<std::hex<<(void *)*o<<std::dec<<" born: "<<Time::ToString_seconds(birth_time-Utils::GetTimeReference())<<" after "<<Time::ToString_seconds(now-birth_time)<<std::endl;
                    //std::cout<<std::hex<<(void *)*o<<std::dec<<" ------------kill "<<input->object->get_oid()<<" ignored "<<std::endl;
                    o = overlays.erase(o);
                } else {
                    //void *oo=*o;
                    Overlay *offspring = (*o)->reduce_view(input);

                    if (offspring) {
                        overlays.push_front(offspring);
                        //std::cout<<Time::ToString_seconds(t)<<" "<<std::hex<<oo<<std::dec<<" born: "<<Time::ToString_seconds(((PGMOverlay *)oo)->get_birth_time()-Utils::GetTimeReference())<<" reduced "<<input->object->get_oid()<<" "<<input->get_sync()<<" offspring: "<<std::hex<<offspring<<std::dec<<std::endl;
                        //std::cout<<std::hex<<(void *)oo<<std::dec<<" --------------- reduced "<<input->object->get_oid()<<" "<<input->get_sync()<<std::endl;
                    }

                    if (!is_alive()) {
                        break;
                    }

                    ++o;
                }
            }
        }
    } else {
        std::lock_guard<std::mutex> guard(m_reductionMutex);

        for (o = overlays.begin(); o != overlays.end();) {
            if ((*o)->is_invalidated()) {
                o = overlays.erase(o);
            } else {
                Overlay *offspring = (*o)->reduce_view(input);

                if (offspring) {
                    overlays.push_front(offspring);
                }

                if (!is_alive()) {
                    break;
                }

                ++o;
            }
        }
    }
}